

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O2

QString * QNetworkInterfaceManager::interfaceNameFromIndex
                    (QString *__return_storage_ptr__,uint index)

{
  long lVar1;
  int __fd;
  int iVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  ifreq req;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = ::socket(2,0x80002,0);
  if (-1 < __fd) {
    req.ifr_ifru.ifru_settings.size = 0xaaaaaaaa;
    req.ifr_ifru.ifru_map.mem_end._0_4_ = 0xaaaaaaaa;
    req.ifr_ifru.ifru_map.mem_end._4_4_ = 0xaaaaaaaa;
    req.ifr_ifru._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    req.ifr_ifrn._0_4_ = 0xaaaaaaaa;
    req.ifr_ifrn._4_4_ = 0xaaaaaaaa;
    req.ifr_ifrn._8_4_ = 0xaaaaaaaa;
    req.ifr_ifrn._12_4_ = 0xaaaaaaaa;
    req.ifr_ifru.ifru_settings.type = index;
    iVar2 = ioctl(__fd,0x8910);
    qt_safe_close(__fd);
    if (-1 < iVar2) {
      psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray((char *)&req,0x10);
      QVar4.m_data = psVar3;
      QVar4.m_size = (qsizetype)__return_storage_ptr__;
      QString::fromLatin1(QVar4);
      goto LAB_0021827a;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0021827a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QNetworkInterfaceManager::interfaceNameFromIndex(uint index)
{
    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = index;

        if (qt_safe_ioctl(socket, SIOCGIFNAME, &req) >= 0) {
            qt_safe_close(socket);
            return QString::fromLatin1(req.ifr_name);
        }
        qt_safe_close(socket);
    }
    return QString();
}